

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::Texture1DArrayView::sample(Texture1DArrayView *this,Sampler *sampler,float s,float t,float lod)

{
  WrapMode WVar1;
  undefined4 numLevels;
  IVec2 *in_RDX;
  Vec4 VVar2;
  
  numLevels = sampler->wrapR;
  WVar1 = sampler->wrapS;
  floorf(t + 0.5);
  VVar2 = sampleLevelArray1DOffset
                    ((ConstPixelBufferAccess *)this,numLevels,(Sampler *)(ulong)WVar1,s,lod,in_RDX);
  return (Vec4)VVar2.m_data;
}

Assistant:

Vec4 Texture1DArrayView::sample (const Sampler& sampler, float s, float t, float lod) const
{
	return sampleLevelArray1D(m_levels, m_numLevels, sampler, s, selectLayer(t), lod);
}